

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav_s24_to_f32(float *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  int sample32;
  uint s2;
  uint s1;
  uint s0;
  size_t i;
  size_t sampleCount_local;
  drwav_uint8 *pIn_local;
  float *pOut_local;
  
  if ((pOut != (float *)0x0) && (pIn != (drwav_uint8 *)0x0)) {
    pOut_local = pOut;
    for (i = 0; i < sampleCount; i = i + 1) {
      *pOut_local = (float)(int)((uint)pIn[i * 3] << 8 | (uint)pIn[i * 3 + 1] << 0x10 |
                                (uint)pIn[i * 3 + 2] << 0x18) / 2.1474836e+09;
      pOut_local = pOut_local + 1;
    }
  }
  return;
}

Assistant:

void drwav_s24_to_f32(float* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    if (pOut == NULL || pIn == NULL) {
        return;
    }

    for (size_t i = 0; i < sampleCount; ++i) {
        unsigned int s0 = pIn[i*3 + 0];
        unsigned int s1 = pIn[i*3 + 1];
        unsigned int s2 = pIn[i*3 + 2];

        int sample32 = (int)((s0 << 8) | (s1 << 16) | (s2 << 24));
        *pOut++ = (float)(sample32 / 2147483648.0);
    }
}